

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timezone.cpp
# Opt level: O3

int32_t icu_63::TimeZone::getRegion
                  (UnicodeString *id,char *region,int32_t capacity,UErrorCode *status)

{
  short sVar1;
  int8_t iVar2;
  int32_t iVar3;
  int32_t length;
  UChar *s;
  UErrorCode status_1;
  UErrorCode local_2c;
  
  *region = '\0';
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    sVar1 = (id->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar3 = (id->fUnion).fFields.fLength;
    }
    else {
      iVar3 = (int)sVar1 >> 5;
    }
    iVar2 = UnicodeString::doCompare(id,0,iVar3,L"Etc/Unknown",0,0xb);
    if (iVar2 != '\0') {
      local_2c = U_ZERO_ERROR;
      s = getRegion(id,&local_2c);
      if (s != (UChar *)0x0) {
        iVar3 = u_strlen_63(s);
        length = uprv_min_63(iVar3,capacity);
        u_UCharsToChars_63(s,region,length);
        if (capacity < iVar3) {
          *status = U_BUFFER_OVERFLOW_ERROR;
          return iVar3;
        }
        iVar3 = u_terminateChars_63(region,capacity,iVar3,status);
        return iVar3;
      }
    }
    *status = U_ILLEGAL_ARGUMENT_ERROR;
  }
  return 0;
}

Assistant:

int32_t
TimeZone::getRegion(const UnicodeString& id, char *region, int32_t capacity, UErrorCode& status)
{
    int32_t resultLen = 0;
    *region = 0;
    if (U_FAILURE(status)) {
        return 0;
    }

    const UChar *uregion = NULL;
    // "Etc/Unknown" is not a system zone ID,
    // but in the zone data
    if (id.compare(UNKNOWN_ZONE_ID, UNKNOWN_ZONE_ID_LENGTH) != 0) {
        uregion = getRegion(id);
    }
    if (uregion == NULL) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }
    resultLen = u_strlen(uregion);
    // A region code is represented by invariant characters
    u_UCharsToChars(uregion, region, uprv_min(resultLen, capacity));

    if (capacity < resultLen) {
        status = U_BUFFER_OVERFLOW_ERROR;
        return resultLen;
    }

    return u_terminateChars(region, capacity, resultLen, &status);
}